

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O1

uint64_t cpu_ldq_data_ra_mipsel
                   (CPUArchState_conflict8 *env,target_ulong_conflict ptr,uintptr_t retaddr)

{
  uint64_t uVar1;
  TCGMemOpIdx oi;
  
  oi = 0x33;
  if ((env->hflags >> 0x1c & 1) == 0) {
    oi = env->hflags & 3 | 0x30;
  }
  uVar1 = load_helper(env,ptr,oi,retaddr,MO_64,false,helper_le_ldq_mmu_mipsel);
  return uVar1;
}

Assistant:

uint64_t cpu_ldq_data_ra(CPUArchState *env, target_ulong ptr, uintptr_t retaddr)
{
    return cpu_ldq_mmuidx_ra(env, ptr, cpu_mmu_index(env, false), retaddr);
}